

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

gs_val_t * gs_eval_expr(gs_val_t *__return_storage_ptr__,gs_eval_t *eval,gs_expr_t *expr)

{
  gs_val_t local_120;
  gs_val_t local_108;
  gs_val_t local_f0;
  gs_val_t local_d8;
  gs_val_t local_c0;
  gs_val_t local_a8;
  gs_val_t local_90;
  gs_val_t local_78;
  gs_val_t local_60;
  gs_val_t local_48;
  gs_val_t local_30;
  gs_expr_t *local_18;
  gs_expr_t *expr_local;
  gs_eval_t *eval_local;
  
  local_18 = expr;
  expr_local = (gs_expr_t *)eval;
  switch(expr->type) {
  case GS_EXPR_BINARY_OP:
    gs_eval_expr_binary_op(&local_30,eval,expr);
    __return_storage_ptr__->type = local_30.type;
    __return_storage_ptr__->is_return = local_30.is_return;
    *(undefined3 *)&__return_storage_ptr__->field_0x5 = local_30._5_3_;
    (__return_storage_ptr__->field_2).vec2_val = local_30.field_2.vec2_val;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_30.field_2._8_8_;
    break;
  case GS_EXPR_ASSIGNMENT:
    gs_eval_expr_assignment(&local_48,eval,expr);
    __return_storage_ptr__->type = local_48.type;
    __return_storage_ptr__->is_return = local_48.is_return;
    *(undefined3 *)&__return_storage_ptr__->field_0x5 = local_48._5_3_;
    (__return_storage_ptr__->field_2).vec2_val = local_48.field_2.vec2_val;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_48.field_2._8_8_;
    break;
  case GS_EXPR_INT:
    gs_eval_expr_int(&local_60,eval,expr);
    __return_storage_ptr__->type = local_60.type;
    __return_storage_ptr__->is_return = local_60.is_return;
    *(undefined3 *)&__return_storage_ptr__->field_0x5 = local_60._5_3_;
    (__return_storage_ptr__->field_2).vec2_val = local_60.field_2.vec2_val;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_60.field_2._8_8_;
    break;
  case GS_EXPR_FLOAT:
    gs_eval_expr_float(&local_78,eval,expr);
    __return_storage_ptr__->type = local_78.type;
    __return_storage_ptr__->is_return = local_78.is_return;
    *(undefined3 *)&__return_storage_ptr__->field_0x5 = local_78._5_3_;
    (__return_storage_ptr__->field_2).vec2_val = local_78.field_2.vec2_val;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_78.field_2._8_8_;
    break;
  case GS_EXPR_SYMBOL:
    gs_eval_expr_symbol(&local_90,eval,expr);
    __return_storage_ptr__->type = local_90.type;
    __return_storage_ptr__->is_return = local_90.is_return;
    *(undefined3 *)&__return_storage_ptr__->field_0x5 = local_90._5_3_;
    (__return_storage_ptr__->field_2).vec2_val = local_90.field_2.vec2_val;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_90.field_2._8_8_;
    break;
  case GS_EXPR_STRING:
    gs_eval_expr_string(&local_a8,eval,expr);
    __return_storage_ptr__->type = local_a8.type;
    __return_storage_ptr__->is_return = local_a8.is_return;
    *(undefined3 *)&__return_storage_ptr__->field_0x5 = local_a8._5_3_;
    (__return_storage_ptr__->field_2).vec2_val = local_a8.field_2.vec2_val;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_a8.field_2._8_8_;
    break;
  case GS_EXPR_CALL:
    gs_eval_expr_call(&local_c0,eval,expr);
    __return_storage_ptr__->type = local_c0.type;
    __return_storage_ptr__->is_return = local_c0.is_return;
    *(undefined3 *)&__return_storage_ptr__->field_0x5 = local_c0._5_3_;
    (__return_storage_ptr__->field_2).vec2_val = local_c0.field_2.vec2_val;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_c0.field_2._8_8_;
    break;
  case GS_EXPR_MEMBER_ACCESS:
    gs_eval_expr_member_access(&local_d8,eval,expr);
    __return_storage_ptr__->type = local_d8.type;
    __return_storage_ptr__->is_return = local_d8.is_return;
    *(undefined3 *)&__return_storage_ptr__->field_0x5 = local_d8._5_3_;
    (__return_storage_ptr__->field_2).vec2_val = local_d8.field_2.vec2_val;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_d8.field_2._8_8_;
    break;
  case GS_EXPR_ARRAY_ACCESS:
    gs_eval_expr_array_access(&local_f0,eval,expr);
    __return_storage_ptr__->type = local_f0.type;
    __return_storage_ptr__->is_return = local_f0.is_return;
    *(undefined3 *)&__return_storage_ptr__->field_0x5 = local_f0._5_3_;
    (__return_storage_ptr__->field_2).vec2_val = local_f0.field_2.vec2_val;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_f0.field_2._8_8_;
    break;
  case GS_EXPR_ARRAY_DECL:
    gs_eval_expr_array_decl(&local_108,eval,expr);
    __return_storage_ptr__->type = local_108.type;
    __return_storage_ptr__->is_return = local_108.is_return;
    *(undefined3 *)&__return_storage_ptr__->field_0x5 = local_108._5_3_;
    (__return_storage_ptr__->field_2).vec2_val = local_108.field_2.vec2_val;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_108.field_2._8_8_;
    break;
  case GS_EXPR_CAST:
    gs_eval_expr_cast(&local_120,eval,expr);
    __return_storage_ptr__->type = local_120.type;
    __return_storage_ptr__->is_return = local_120.is_return;
    *(undefined3 *)&__return_storage_ptr__->field_0x5 = local_120._5_3_;
    (__return_storage_ptr__->field_2).vec2_val = local_120.field_2.vec2_val;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_120.field_2._8_8_;
  }
  return __return_storage_ptr__;
}

Assistant:

static gs_val_t gs_eval_expr(gs_eval_t *eval, gs_expr_t *expr) {
    gs_val_t val;
    switch (expr->type) {
        case GS_EXPR_BINARY_OP:
            val = gs_eval_expr_binary_op(eval, expr);
            break;
        case GS_EXPR_ASSIGNMENT:
            val = gs_eval_expr_assignment(eval, expr);
            break;
        case GS_EXPR_INT:
            val = gs_eval_expr_int(eval, expr);
            break;
        case GS_EXPR_FLOAT:
            val = gs_eval_expr_float(eval, expr);
            break;
        case GS_EXPR_SYMBOL:
            val = gs_eval_expr_symbol(eval, expr);
            break;
        case GS_EXPR_STRING:
            val = gs_eval_expr_string(eval, expr);
            break;
        case GS_EXPR_CALL:
            val = gs_eval_expr_call(eval, expr);
            break;
        case GS_EXPR_MEMBER_ACCESS:
            val = gs_eval_expr_member_access(eval, expr);
            break;
        case GS_EXPR_ARRAY_ACCESS:
            val = gs_eval_expr_array_access(eval, expr);
            break;
        case GS_EXPR_ARRAY_DECL:
            val = gs_eval_expr_array_decl(eval, expr);
            break;
        case GS_EXPR_CAST:
            val = gs_eval_expr_cast(eval, expr);
            break;
    }
    return val;
}